

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int v;
  int count;
  double value;
  string file;
  App app;
  allocator local_38a;
  allocator local_389;
  int local_388;
  int local_384;
  double local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  App local_1f8;
  
  std::__cxx11::string::string((string *)&local_218,"K3Pi goofit fitter",(allocator *)&local_378);
  CLI::App::App(&local_1f8,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_238,"-f,--file,file",(allocator *)&local_380);
  std::__cxx11::string::string((string *)&local_258,"File name",(allocator *)&local_384);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_1f8,&local_238,&local_378,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string((string *)&local_278,"-c,--count",(allocator *)&local_380);
  std::__cxx11::string::string((string *)&local_298,"Counter",(allocator *)&local_388);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(&local_1f8,&local_278,&local_384,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string((string *)&local_2b8,"--flag",(allocator *)&local_380);
  std::__cxx11::string::string
            ((string *)&local_2d8,"Some flag that can be passed multiple times",&local_38a);
  CLI::App::add_flag<int,_(CLI::detail::enabler)0>(&local_1f8,&local_2b8,&local_388,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::string((string *)&local_2f8,"-d,--double",&local_38a);
  std::__cxx11::string::string((string *)&local_318,"Some Value",&local_389);
  CLI::App::add_option<double,_(CLI::detail::enabler)0>(&local_1f8,&local_2f8,&local_380,&local_318)
  ;
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  CLI::App::parse(&local_1f8,argc,argv);
  poVar1 = std::operator<<((ostream *)&std::cout,"Working on file: ");
  poVar1 = std::operator<<(poVar1,(string *)&local_378);
  poVar1 = std::operator<<(poVar1,", direct count: ");
  std::__cxx11::string::string((string *)&local_338,"--file",&local_38a);
  CLI::App::count(&local_1f8,&local_338);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", opt count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_338);
  poVar1 = std::operator<<((ostream *)&std::cout,"Working on count: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_384);
  poVar1 = std::operator<<(poVar1,", direct count: ");
  std::__cxx11::string::string((string *)&local_358,"--count",&local_38a);
  CLI::App::count(&local_1f8,&local_358);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", opt count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_358);
  poVar1 = std::operator<<((ostream *)&std::cout,"Recieved flag: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_388);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,") times\n");
  std::operator<<((ostream *)&std::cout,"Some value: ");
  poVar1 = std::ostream::_M_insert<double>(local_380);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_378);
  CLI::App::~App(&local_1f8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name");

    int count;
    CLI::Option *copt = app.add_option("-c,--count", count, "Counter");

    int v;
    CLI::Option *flag = app.add_flag("--flag", v, "Some flag that can be passed multiple times");

    double value; // = 3.14;
    app.add_option("-d,--double", value, "Some Value");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << std::endl;
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << std::endl;
    std::cout << "Recieved flag: " << v << " (" << flag->count() << ") times\n";
    std::cout << "Some value: " << value << std::endl;

    return 0;
}